

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderIntermediate.h
# Opt level: O0

void __thiscall
Assimp::Blender::TempArray<std::vector,_aiCamera>::~TempArray
          (TempArray<std::vector,_aiCamera> *this)

{
  bool bVar1;
  reference ppaVar2;
  aiCamera *elem;
  iterator __end0;
  iterator __begin0;
  mywrap *__range3;
  TempArray<std::vector,_aiCamera> *this_local;
  
  __end0 = ::std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::begin(&this->arr);
  elem = (aiCamera *)::std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::end(&this->arr);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<aiCamera_**,_std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>_>
                                *)&elem);
    if (!bVar1) break;
    ppaVar2 = __gnu_cxx::
              __normal_iterator<aiCamera_**,_std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>_>
              ::operator*(&__end0);
    if (*ppaVar2 != (aiCamera *)0x0) {
      operator_delete(*ppaVar2);
    }
    __gnu_cxx::__normal_iterator<aiCamera_**,_std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>_>
    ::operator++(&__end0);
  }
  ::std::vector<aiCamera_*,_std::allocator<aiCamera_*>_>::~vector(&this->arr);
  return;
}

Assistant:

~TempArray () {
            for(T* elem : arr) {
                delete elem;
            }
        }